

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p,uchar *tweak32)

{
  int iVar1;
  secp256k1_scalar term;
  int overflow;
  secp256k1_gej pt;
  secp256k1_fe aux [4];
  secp256k1_ge pre_a [4];
  secp256k1_strauss_point_state ps [1];
  secp256k1_scalar local_740;
  int local_73c;
  secp256k1_strauss_state local_738;
  secp256k1_gej local_720;
  secp256k1_fe local_688 [4];
  secp256k1_ge local_5c8 [4];
  secp256k1_strauss_point_state local_428;
  
  local_73c = 0;
  secp256k1_scalar_set_b32(&local_740,tweak32,&local_73c);
  iVar1 = 0;
  if (local_73c == 0) {
    secp256k1_gej_set_ge(&local_720,p);
    local_738.aux = local_688;
    local_738.pre_a = local_5c8;
    local_738.ps = &local_428;
    secp256k1_ecmult_strauss_wnaf
              (&local_738,&local_720,1,&local_720,&secp256k1_scalar_one,&local_740);
    secp256k1_gej_verify(&local_720);
    iVar1 = 0;
    if (local_720.infinity == 0) {
      secp256k1_ge_set_gej(p,&local_720);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    return !overflow && secp256k1_eckey_pubkey_tweak_add(p, &term);
}